

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::MockCodeGenerator::MockCodeGenerator
          (MockCodeGenerator *this,string_view name)

{
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *this_00;
  int iVar1;
  size_type __rlen;
  size_t __n;
  long *__s1;
  string_view sVar2;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  allocator_type local_31;
  FieldDescriptor *local_30;
  
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__MockCodeGenerator_018f7f00;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->name_,name._M_str,name._M_str + name._M_len);
  this->suppressed_features_ = 0;
  this->minimum_edition_ = EDITION_PROTO2;
  this->maximum_edition_ = EDITION_2023;
  local_30 = GetExtensionReflection<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false,google::protobuf::DescriptorPool>
                       ((ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                         *)&pb::test);
  this_00 = &this->feature_extensions_;
  __l._M_len = 1;
  __l._M_array = &local_30;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(this_00,__l,&local_31);
  sVar2 = compiler::anon_unknown_0::GetTestCase();
  __s1 = (long *)sVar2._M_str;
  __n = sVar2._M_len;
  switch(__n) {
  case 0xb:
    if (*(long *)((long)__s1 + 3) == 0x736e6f6974696465 && *__s1 == 0x69746964655f6f6e) {
      *(byte *)&this->suppressed_features_ = (byte)this->suppressed_features_ | 2;
    }
    else {
      iVar1 = bcmp(__s1,"low_minimum",__n);
      if (iVar1 == 0) {
        this->maximum_edition_ = EDITION_1_TEST_ONLY;
      }
    }
    break;
  case 0xc:
    iVar1 = bcmp(__s1,"high_maximum",__n);
    if (iVar1 == 0) {
      this->maximum_edition_ = EDITION_99997_TEST_ONLY;
    }
    break;
  case 0x10:
    iVar1 = bcmp(__s1,"invalid_features",__n);
    if (iVar1 == 0) {
      local_30 = (FieldDescriptor *)0x0;
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_assign_aux<google::protobuf::FieldDescriptor_const*const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)this_00,&local_30);
    }
    break;
  case 0x13:
    iVar1 = bcmp(__s1,"no_feature_defaults",__n);
    if (iVar1 == 0) {
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_assign_aux<google::protobuf::FieldDescriptor_const*const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)this_00,0,0);
    }
  }
  return;
}

Assistant:

MockCodeGenerator::MockCodeGenerator(absl::string_view name) : name_(name) {
  absl::string_view key = GetTestCase();
  if (key == "no_editions") {
    suppressed_features_ |= CodeGenerator::FEATURE_SUPPORTS_EDITIONS;
  } else if (key == "invalid_features") {
    feature_extensions_ = {nullptr};
  } else if (key == "no_feature_defaults") {
    feature_extensions_ = {};
  } else if (key == "high_maximum") {
    maximum_edition_ = Edition::EDITION_99997_TEST_ONLY;
  } else if (key == "low_minimum") {
    maximum_edition_ = Edition::EDITION_1_TEST_ONLY;
  }
}